

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
RepeatedPtrFieldWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::Clear(RepeatedPtrFieldWrapper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,Field *data)

{
  int iVar1;
  long lVar2;
  undefined8 *puVar3;
  long lVar4;
  
  iVar1 = *(int *)((long)data + 8);
  if (0 < (long)iVar1) {
    lVar2 = *(long *)((long)data + 0x10);
    lVar4 = 0;
    do {
      puVar3 = *(undefined8 **)(lVar2 + 8 + lVar4 * 8);
      lVar4 = lVar4 + 1;
      puVar3[1] = 0;
      *(undefined1 *)*puVar3 = 0;
    } while (iVar1 != lVar4);
    *(undefined4 *)((long)data + 8) = 0;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Clear() {
  const int n = current_size_;
  GOOGLE_DCHECK_GE(n, 0);
  if (n > 0) {
    void* const* elements = rep_->elements;
    int i = 0;
    do {
      TypeHandler::Clear(cast<TypeHandler>(elements[i++]));
    } while (i < n);
    current_size_ = 0;
  }
}